

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall asmjit::ZoneBitVector::_append(ZoneBitVector *this,ZoneHeap *heap,bool value)

{
  long *plVar1;
  long *plVar2;
  ZoneHeap *this_00;
  char cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Error EVar6;
  undefined8 *puVar7;
  void *pvVar8;
  sbyte sVar9;
  sbyte sVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  ulong newLength;
  ZoneHeap *extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  uint uVar14;
  ZoneBitVector *pZVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_t sStack_68;
  ZoneBitVector *pZStack_60;
  size_t sStack_38;
  
  uVar16 = *(ulong *)(this + 0x10);
  uVar11 = 0x80;
  if (0x7f < uVar16) {
    if (uVar16 < 0x4000001) {
      uVar11 = uVar16 * 2;
    }
    else {
      uVar11 = uVar16 + 0x4000000;
    }
  }
  newLength = *(long *)(this + 8) + 1;
  if ((uVar16 <= uVar11) || (uVar11 = newLength, uVar16 < newLength)) {
    EVar6 = _resize(this,heap,newLength,uVar11,value);
    return EVar6;
  }
  _append();
  if (extraout_RDX <= heap) {
    return (uint)(extraout_RDX < heap) + (uint)(extraout_RDX < heap) * 2;
  }
  if (*(ZoneHeap **)(this + 8) < heap) {
    fill();
LAB_00119875:
    fill();
LAB_0011987a:
    fill();
  }
  else {
    if (*(ZoneHeap **)(this + 8) < extraout_RDX) goto LAB_00119875;
    this = *(ZoneBitVector **)this;
    if (this == (ZoneBitVector *)0x0) goto LAB_0011987a;
    cVar3 = (char)newLength;
    uVar11 = (ulong)heap >> 6;
    uVar14 = (uint)heap & 0x3f;
    heap = (ZoneHeap *)(ulong)uVar14;
    uVar16 = (ulong)extraout_RDX >> 6;
    uVar13 = (uint)extraout_RDX & 0x3f;
    sVar9 = (sbyte)uVar13;
    if (heap == (ZoneHeap *)0x0) {
LAB_00119788:
      auVar5 = _DAT_00135c00;
      auVar4 = _DAT_00135bf0;
      lVar17 = uVar16 - uVar11;
      if (uVar11 <= uVar16 && lVar17 != 0) {
        lVar18 = lVar17 + -1;
        auVar20._8_4_ = (int)lVar18;
        auVar20._0_8_ = lVar18;
        auVar20._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar19 = 0;
        auVar20 = auVar20 ^ _DAT_00135c00;
        do {
          auVar21._8_4_ = (int)uVar19;
          auVar21._0_8_ = uVar19;
          auVar21._12_4_ = (int)(uVar19 >> 0x20);
          auVar21 = (auVar21 | auVar4) ^ auVar5;
          if ((bool)(~(auVar21._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar21._0_4_ ||
                      auVar20._4_4_ < auVar21._4_4_) & 1)) {
            *(ulong *)(this + uVar19 * 8 + uVar11 * 8) = -(newLength & 0xff);
          }
          if ((auVar21._12_4_ != auVar20._12_4_ || auVar21._8_4_ <= auVar20._8_4_) &&
              auVar21._12_4_ <= auVar20._12_4_) {
            *(ulong *)(this + uVar19 * 8 + uVar11 * 8 + 8) = -(newLength & 0xff);
          }
          uVar19 = uVar19 + 2;
        } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar19);
      }
      if (((ulong)extraout_RDX & 0x3f) != 0) {
        uVar11 = -1L << sVar9;
        if (cVar3 == '\0') {
          *(ulong *)(this + uVar16 * 8) = *(ulong *)(this + uVar16 * 8) & uVar11;
        }
        else {
          *(ulong *)(this + uVar16 * 8) = *(ulong *)(this + uVar16 * 8) | ~uVar11;
        }
      }
      return 0;
    }
    sVar10 = (sbyte)uVar14;
    if (uVar11 != uVar16) {
      if (cVar3 == '\0') {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) & ~(-1L << sVar10);
      }
      else {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) | -1L << sVar10;
      }
      uVar11 = uVar11 + 1;
      goto LAB_00119788;
    }
    if (uVar14 < uVar13) {
      uVar16 = ~(-1L << (sVar9 - sVar10 & 0x3fU)) << sVar10;
      if (cVar3 == '\0') {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) & ~uVar16;
      }
      else {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) | uVar16;
      }
      return 0;
    }
  }
  fill();
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    if (*(long **)(this + 8) != (long *)0x0) {
      plVar12 = *(long **)(this + 8);
      if (*plVar1 == 0) {
        pZVar15 = this;
        ZoneStackBase::_init();
        this_00 = *(ZoneHeap **)pZVar15;
        pZStack_60 = this;
        if (this_00 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar11 = (ulong)heap & 0xffffffff;
          lVar17 = *(long *)(pZVar15 + uVar11 * 8 + 8);
          if (*(long *)(lVar17 + 0x10) != *(long *)(lVar17 + 0x18)) {
            if (this_00->_zone != (Zone *)0x0) {
              pvVar8 = ZoneHeap::_alloc(this_00,0x200,&sStack_68);
              if (pvVar8 == (void *)0x0) {
                return 1;
              }
              *(undefined8 *)((long)pvVar8 + uVar11 * 8) = 0;
              *(long *)((long)pvVar8 + (ulong)((int)heap == 0) * 8) = lVar17;
              *(long *)((long)pvVar8 + 0x10) = extraout_RDX_01 + (long)pvVar8;
              *(long *)((long)pvVar8 + 0x18) = extraout_RDX_01 + (long)pvVar8;
              *(void **)(lVar17 + uVar11 * 8) = pvVar8;
              *(void **)(pZVar15 + uVar11 * 8 + 8) = pvVar8;
              return 0;
            }
            goto LAB_001199b6;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_001199b6:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      do {
        plVar2 = (long *)plVar12[1];
        *plVar12 = plVar1[10];
        plVar1[10] = (long)plVar12;
        plVar12 = plVar2;
      } while (plVar2 != (long *)0x0);
    }
    *(long *)this = 0;
    *(long *)(this + 8) = 0;
    *(long *)(this + 0x10) = 0;
  }
  EVar6 = 0;
  if (heap != (ZoneHeap *)0x0) {
    if (heap->_zone == (Zone *)0x0) {
      ZoneStackBase::_init();
    }
    else {
      puVar7 = (undefined8 *)ZoneHeap::_alloc(heap,0x200,&sStack_38);
      if (puVar7 != (undefined8 *)0x0) {
        *puVar7 = 0;
        puVar7[1] = 0;
        puVar7[2] = extraout_RDX_00 + (long)puVar7;
        puVar7[3] = extraout_RDX_00 + (long)puVar7;
        *(ZoneHeap **)this = heap;
        *(undefined8 **)(this + 8) = puVar7;
        *(undefined8 **)(this + 0x10) = puVar7;
        return 0;
      }
    }
    EVar6 = 1;
  }
  return EVar6;
}

Assistant:

Error ZoneBitVector::_append(ZoneHeap* heap, bool value) noexcept {
  size_t kThreshold = Globals::kAllocThreshold * 8;
  size_t newLength = _length + 1;
  size_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    // It's technically impossible that `_length + 1` overflows.
    idealCapacity = newLength;
    ASMJIT_ASSERT(idealCapacity > _capacity);
  }

  return _resize(heap, newLength, idealCapacity, value);
}